

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atomprops.c
# Opt level: O1

int identifyAtom(char *name,char *resname,int Verbose)

{
  byte bVar1;
  char *__s;
  int iVar2;
  uint uVar3;
  long lVar4;
  size_t sVar5;
  char cVar6;
  uint uVar7;
  undefined *puVar8;
  char *__format;
  uint uVar9;
  bool bVar10;
  char warnresn [5];
  char warnstr [5];
  char local_38 [8];
  char local_30 [8];
  
  uVar9 = 0xffffffff;
  uVar7 = 0;
  uVar3 = 0;
  switch(*name) {
  case ' ':
  case '\"':
  case '\'':
  case '*':
  case '+':
  case '-':
  case '0':
  case '1':
  case '2':
  case '3':
  case '4':
  case '5':
  case '6':
  case '7':
  case '8':
  case '9':
  case '_':
  case '`':
    uVar3 = uVar7;
    switch(name[1]) {
    case 'A':
      if (name[3] == '2') goto switchD_001203ea_caseD_4e;
      uVar3 = 0;
      if (name[3] == '1') goto switchD_001203ea_caseD_4f;
      goto switchD_00120138_caseD_21;
    case 'B':
      uVar9 = 0x15;
      break;
    case 'C':
      uVar9 = 6;
      break;
    case 'D':
      uVar9 = 2;
      break;
    default:
      goto switchD_00120138_caseD_21;
    case 'F':
      uVar9 = 10;
      break;
    case 'H':
      bVar1 = name[2];
      uVar9 = 2;
      if (bVar1 < 0x47) {
        if (bVar1 == 0x45) {
          iVar2 = fixAtomName(name,resname,2);
          bVar10 = iVar2 == 0;
          uVar9 = 0x2f;
        }
        else {
          if (bVar1 != 0x46) goto switchD_00120138_caseD_21;
          iVar2 = fixAtomName(name,resname,2);
          bVar10 = iVar2 == 0;
          uVar9 = 0x30;
        }
      }
      else if (bVar1 == 0x47) {
        iVar2 = fixAtomName(name,resname,2);
        bVar10 = iVar2 == 0;
        uVar9 = 0x31;
      }
      else {
        if (bVar1 != 0x4f) goto switchD_00120138_caseD_21;
        iVar2 = fixAtomName(name,resname,2);
        bVar10 = iVar2 == 0;
        uVar9 = 0x32;
      }
      if (bVar10) {
        uVar9 = 2;
      }
      break;
    case 'I':
      uVar9 = 0x33;
      break;
    case 'K':
      uVar9 = 0x36;
      break;
    case 'N':
      uVar9 = 8;
      break;
    case 'O':
      uVar9 = 9;
      break;
    case 'P':
      uVar9 = 0xc;
      break;
    case 'S':
      if ((*name == ' ') && (name[2] == 'E')) {
        uVar9 = 0x57;
        goto LAB_00120a65;
      }
      uVar9 = 0xb;
      break;
    case 'U':
      uVar9 = 100;
      break;
    case 'V':
      uVar9 = 0x65;
      break;
    case 'W':
      uVar9 = 0x66;
      break;
    case 'Y':
      uVar9 = 0x68;
    }
    goto LAB_001207bb;
  case 'A':
    uVar3 = 0;
    if ((byte)(name[1] + 0xbdU) < 0x13) {
      lVar4 = (ulong)(byte)(name[1] + 0xbdU) * 4;
      uVar3 = *(uint *)(&DAT_0013636c + lVar4);
      puVar8 = &DAT_00136278;
LAB_001205e2:
      uVar9 = *(uint *)(puVar8 + lVar4);
    }
    break;
  case 'B':
    bVar1 = name[1];
    if (bVar1 < 0x49) {
      if (bVar1 == 0x41) {
        uVar9 = 0x16;
      }
      else {
        uVar3 = uVar7;
        if (bVar1 != 0x45) break;
        uVar9 = 0x17;
      }
    }
    else if (bVar1 == 0x49) {
      uVar9 = 0x18;
    }
    else if (bVar1 == 0x4b) {
      uVar9 = 0x19;
    }
    else {
      uVar3 = uVar7;
      if (bVar1 != 0x52) break;
      uVar9 = 0x1a;
    }
    goto LAB_001207bb;
  case 'C':
    if ((byte)(name[1] + 0xbfU) < 0x15) {
      lVar4 = (ulong)(byte)(name[1] + 0xbfU) * 4;
      uVar3 = *(uint *)(&DAT_001362c4 + lVar4);
      puVar8 = &DAT_00136318;
      goto LAB_001205e2;
    }
LAB_001206f5:
    uVar9 = 6;
    goto LAB_00120a65;
  case 'D':
    cVar6 = name[1];
    switch(cVar6) {
    case 'N':
      goto switchD_001203ea_caseD_4e;
    case 'O':
switchD_001203ea_caseD_4f:
      uVar9 = 9;
      break;
    case 'P':
      uVar9 = 0xc;
      break;
    default:
      if (cVar6 == 'Y') {
        uVar9 = 0x25;
        goto LAB_001207bb;
      }
      if (cVar6 == 'C') goto LAB_001206f5;
    case 'H':
    case 'I':
    case 'J':
    case 'K':
    case 'L':
    case 'M':
      uVar9 = 2;
    }
    goto LAB_00120a65;
  case 'E':
    uVar3 = 0;
    if ((byte)(name[1] + 0xbdU) < 0x13) {
      lVar4 = (ulong)(byte)(name[1] + 0xbdU) * 4;
      uVar3 = *(uint *)(&DAT_0013636c + lVar4);
      puVar8 = &DAT_001363b8;
      goto LAB_001205e2;
    }
    break;
  case 'F':
    uVar3 = 0;
    if ((byte)(name[1] + 0xbdU) < 0x10) {
      lVar4 = (ulong)(byte)(name[1] + 0xbdU) * 4;
      uVar3 = *(uint *)(&DAT_00136404 + lVar4);
      puVar8 = &DAT_00136444;
      goto LAB_001205e2;
    }
    break;
  case 'G':
    uVar3 = 0;
    if ((byte)(name[1] + 0xbfU) < 0x10) {
      lVar4 = (ulong)(byte)(name[1] + 0xbfU) * 4;
      uVar3 = *(uint *)(&DAT_00136484 + lVar4);
      puVar8 = &DAT_001364c4;
      goto LAB_001205e2;
    }
    break;
  case 'H':
    bVar1 = name[1];
    uVar9 = 2;
    if (bVar1 < 0x47) {
      if (bVar1 == 0x45) {
        iVar2 = fixAtomName(name,resname,1);
        bVar10 = iVar2 == 0;
        uVar9 = 0x2f;
      }
      else {
        uVar3 = uVar7;
        if (bVar1 != 0x46) break;
        iVar2 = fixAtomName(name,resname,1);
        bVar10 = iVar2 == 0;
        uVar9 = 0x30;
      }
    }
    else if (bVar1 == 0x47) {
      iVar2 = fixAtomName(name,resname,1);
      bVar10 = iVar2 == 0;
      uVar9 = 0x31;
    }
    else {
      uVar3 = uVar7;
      if (bVar1 != 0x4f) break;
      iVar2 = fixAtomName(name,resname,1);
      bVar10 = iVar2 == 0;
      uVar9 = 0x32;
    }
    if (bVar10) {
      uVar9 = 2;
    }
    goto LAB_001207bb;
  case 'I':
    if (name[1] == 'R') {
      uVar9 = 0x35;
    }
    else {
      uVar3 = uVar7;
      if (name[1] != 'N') break;
      uVar9 = 0x34;
    }
    goto LAB_001207bb;
  case 'K':
    uVar9 = -(uint)(name[1] != 'R') | 0x37;
    goto LAB_001207bb;
  case 'L':
    cVar6 = name[1];
    if (cVar6 == 'U') {
      uVar9 = 0x3a;
    }
    else if (cVar6 == 'I') {
      uVar9 = 0x39;
    }
    else {
      uVar3 = uVar7;
      if (cVar6 != 'A') break;
      uVar9 = 0x38;
    }
    goto LAB_001207bb;
  case 'M':
    bVar1 = name[1];
    if (bVar1 < 0x4e) {
      if (bVar1 == 0x44) {
        uVar9 = 0x3b;
      }
      else {
        uVar3 = uVar7;
        if (bVar1 != 0x47) break;
        uVar9 = 0x3c;
      }
    }
    else if (bVar1 == 0x4e) {
      uVar9 = 0x3d;
    }
    else {
      uVar3 = uVar7;
      if (bVar1 != 0x4f) break;
      uVar9 = 0x3e;
    }
LAB_001207bb:
    uVar3 = 0;
    break;
  case 'N':
    if ((byte)(name[1] + 0xbfU) < 0x13) {
      lVar4 = (ulong)(byte)(name[1] + 0xbfU) * 4;
      uVar3 = *(uint *)(&DAT_00136504 + lVar4);
      puVar8 = &DAT_00136550;
      goto LAB_001205e2;
    }
switchD_001203ea_caseD_4e:
    uVar9 = 8;
    goto LAB_00120a65;
  case 'O':
    uVar3 = (uint)(name[1] != 'S');
    uVar9 = 0x46;
    if (name[1] != 'S') {
      uVar9 = 9;
    }
    break;
  case 'P':
    bVar1 = name[1];
    uVar3 = 1;
    if (0x4c < bVar1) {
      switch(bVar1) {
      case 0x4d:
        uVar9 = 0x4a;
        break;
      default:
switchD_001202c3_caseD_4e:
        uVar9 = 0xc;
        goto switchD_00120138_caseD_21;
      case 0x4f:
        uVar9 = 0x4b;
        break;
      case 0x52:
        uVar9 = 0x4c;
        break;
      case 0x54:
        uVar9 = 0x4d;
        break;
      case 0x55:
        uVar9 = 0x4e;
      }
      goto LAB_001207bb;
    }
    if (bVar1 == 0x41) {
      uVar9 = 0x47;
    }
    else if (bVar1 == 0x42) {
      uVar9 = 0x48;
    }
    else {
      if (bVar1 != 0x44) goto switchD_001202c3_caseD_4e;
      uVar9 = 0x49;
    }
    break;
  case 'R':
    cVar6 = name[1];
    uVar3 = uVar7;
    switch(cVar6) {
    case 'A':
      uVar9 = 0x4f;
      break;
    case 'B':
      uVar9 = 0x50;
      break;
    case 'C':
    case 'D':
    case 'F':
    case 'G':
      break;
    case 'E':
      uVar9 = 0x51;
      break;
    case 'H':
      uVar9 = 0x52;
      break;
    default:
      if (cVar6 == 'N') {
        uVar9 = 0x53;
      }
      else if (cVar6 == 'U') {
        uVar9 = 0x54;
      }
    }
    break;
  case 'S':
    if ((byte)(name[1] + 0xbeU) < 0x11) {
      lVar4 = (ulong)(byte)(name[1] + 0xbeU) * 4;
      uVar3 = *(uint *)(&DAT_0013659c + lVar4);
      puVar8 = &DAT_001365e0;
      goto LAB_001205e2;
    }
    uVar9 = 0xb;
LAB_00120a65:
    uVar3 = 1;
    break;
  case 'T':
    uVar3 = uVar7;
    if ((byte)(name[1] + 0xbfU) < 0xd) {
      uVar9 = *(uint *)(&DAT_00136624 + (ulong)(byte)(name[1] + 0xbfU) * 4);
    }
    break;
  case 'X':
    uVar9 = -(uint)(name[1] != 'E') | 0x67;
    uVar3 = uVar7;
    break;
  case 'Y':
    uVar9 = -(uint)(name[1] != 'B') | 0x69;
    uVar3 = uVar7;
    break;
  case 'Z':
    if (name[1] == 'R') {
      uVar9 = 0x6b;
      uVar3 = uVar7;
    }
    else {
      uVar3 = uVar7;
      if (name[1] == 'N') {
        uVar9 = 0x6a;
      }
    }
  }
switchD_00120138_caseD_21:
  if (-1 < (int)uVar9) goto LAB_001207c2;
  uVar3 = 1;
  switch(name[1]) {
  case 'A':
    bVar1 = name[2];
    uVar9 = 6;
    if (bVar1 < 0x53) {
      if (bVar1 == 0x47) {
        uVar9 = 0xe;
      }
      else if (bVar1 == 0x4c) {
        uVar9 = 0xf;
      }
    }
    else if (bVar1 == 0x53) {
      uVar9 = 0x12;
    }
    else if (bVar1 == 0x55) {
      uVar9 = 0x14;
    }
    break;
  default:
    uVar9 = 6;
    break;
  case 'D':
  case 'H':
    uVar9 = 2;
    break;
  case 'F':
    bVar10 = name[2] == 'E';
    uVar7 = 0x29;
    goto LAB_001209be;
  case 'G':
    bVar10 = name[2] == 'D';
    uVar7 = 0x2d;
    goto LAB_001209be;
  case 'I':
    uVar9 = 0x33;
    break;
  case 'K':
    uVar9 = 0x36;
    break;
  case 'L':
    bVar10 = name[2] == 'I';
    uVar7 = 0x39;
    goto LAB_001209be;
  case 'M':
    cVar6 = name[2];
    if (cVar6 == 'O') {
      uVar9 = 0x3e;
    }
    else if (cVar6 == 'N') {
      uVar9 = 0x3d;
    }
    else {
      uVar9 = 6;
      if (cVar6 == 'G') {
        uVar9 = 0x3c;
      }
    }
    break;
  case 'N':
    uVar9 = 8;
    break;
  case 'O':
    uVar9 = 9;
    break;
  case 'P':
    uVar9 = 0xc;
    break;
  case 'S':
    uVar9 = 0xb;
    break;
  case 'U':
    uVar9 = 100;
    break;
  case 'V':
    uVar9 = 0x65;
    break;
  case 'W':
    uVar9 = 0x66;
    break;
  case 'Z':
    bVar10 = name[2] == 'N';
    uVar7 = 0x6a;
LAB_001209be:
    uVar9 = 6;
    if (bVar10) {
      uVar9 = uVar7;
    }
  }
LAB_001207c2:
  if ((Verbose != 0) && (uVar3 != 0)) {
    builtin_strncpy(local_30,"____",5);
    builtin_strncpy(local_38,"____",5);
    cVar6 = *name;
    if (cVar6 != '\0') {
      lVar4 = 0;
      do {
        if (local_30[lVar4] == '\0') break;
        if (cVar6 == ' ') {
          cVar6 = '_';
        }
        local_30[lVar4] = cVar6;
        cVar6 = name[lVar4 + 1];
        lVar4 = lVar4 + 1;
      } while (cVar6 != '\0');
    }
    cVar6 = *resname;
    if (cVar6 != '\0') {
      lVar4 = 0;
      do {
        if (local_38[lVar4] == '\0') break;
        if (name[lVar4] == ' ') {
          cVar6 = '_';
        }
        local_38[lVar4] = cVar6;
        cVar6 = resname[lVar4 + 1];
        lVar4 = lVar4 + 1;
      } while (cVar6 != '\0');
    }
    __s = AtomTblIndex[uVar9]->name;
    sVar5 = strlen(__s);
    __format = "WARNING: atom %s from resn %s will be treated as %s\n";
    if (sVar5 == 1) {
      __format = "WARNING: atom %s from resn %s will be treated as  %s\n";
    }
    fprintf(_stderr,__format,local_30,local_38,__s);
  }
  return uVar9;
}

Assistant:

int identifyAtom(char* name, char resname[], int Verbose) {  /*dcr041007 allow warning choice*/
   int n = -1, emitWarning = 0;

   switch(name[0]) {
   case '*': case '\'': case '"': case '`': case '_':
   case '+': case '-':  case ' ':
   case '0': case '1': case '2': case '3': case '4':
   case '5': case '6': case '7': case '8': case '9':
      switch(name[1]) {
      case 'A':
	 switch(name[3]) {
	 case '1': n = atomO; emitWarning = 1; break;
	 case '2': n = atomN; emitWarning = 1; break;
	 } break;
      case 'B': n = atomB; break;
      case 'C': n = atomC; break;
      case 'D': n = atomH; break;
      case 'F': n = atomF; break;
      case 'H':
        switch(name[2]) {
        case 'E': n = fixAtomName(name,resname,2) ? atomHe : atomH; break;
        case 'F': n = fixAtomName(name,resname,2) ? atomHf : atomH; break;
        case 'G': n = fixAtomName(name,resname,2) ? atomHg : atomH; break;
        case 'O': n = fixAtomName(name,resname,2) ? atomHo : atomH; break;
/*        case 'S': n = fixAtomName(name,resname,2) ? atomHs : atomH; break; */
        default : n = atomH; break;
        } break;
      case 'I': n = atomI; break;
      case 'K': n = atomK; break;
      case 'N': n = atomN; break;
      case 'O': n = atomO; break;
      case 'P': n = atomP; break;
    /*case 'S': n = atomS; break;*/
      case 'S':
         if(name[0] == ' ' && name[2] == 'E')
         {/*_SE likely refmac,cns missplaced Selenium atom name dcr041007*/
                n = atomSe; emitWarning = 1; break;
         }
         else  {n = atomS; break;} /*050121 NO warning for other S*/
      case 'U': n = atomU; break;
      case 'V': n = atomV; break;
      case 'W': n = atomW; break;
      case 'Y': n = atomY; break;
      } break;
   case 'A':
      switch(name[1]) {
      case 'C': n = atomC;  emitWarning = 1;break;/*nonstd!*/
      case 'G': n = atomAg; break;
      case 'H': n = atomH;  emitWarning = 1;break;
      case 'L': n = atomAl; break;
      case 'M': n = atomAm; break;
      case 'N': n = atomN;  emitWarning = 1;break;
      case 'O': n = atomO;  emitWarning = 1;break;
      case 'P': n = atomP;  emitWarning = 1;break;
      case 'R': n = atomAr; break;
      case 'S': n = atomAs; break;
      case 'T': n = atomAt; break;
      case 'U': n = atomAu; break;
      } break;
   case 'B':
      switch(name[1]) {
      case 'A': n = atomBa; break;
      case 'E': n = atomBe; break;
      case 'I': n = atomBi; break;
      case 'K': n = atomBk; break;
      case 'R': n = atomBr; break;
      } break;
   case 'C':
      switch(name[1]) {
      case 'A': n = atomCa; break;
      case 'C': n = atomC;  emitWarning = 1;break;
      case 'D': n = atomCd; break;
      case 'E': n = atomCe; break;
      case 'F': n = atomCf; break;
      case 'H': n = atomH;  emitWarning = 1;break;
      case 'L': n = atomCl; break;
      case 'M': n = atomCm; break;
      case 'N': n = atomN;  emitWarning = 1;break;
      case 'O': n = atomCo; emitWarning = 1;break;
      case 'P': n = atomP;  emitWarning = 1;break;
      case 'R': n = atomCr; break;
      case 'S': n = atomCs; break;
      case 'U': n = atomCu; break;
      default:  n = atomC;  emitWarning = 1;break;
      } break;
   case 'D':
      switch(name[1]) {
      case 'Y': n = atomDy; break;
      case 'C': n = atomC;  emitWarning = 1;break;
      case 'H': n = atomH;  emitWarning = 1;break;
      case 'N': n = atomN;  emitWarning = 1;break;
      case 'O': n = atomO;  emitWarning = 1;break;
      case 'P': n = atomP;  emitWarning = 1;break;
      default:  n = atomH;  emitWarning = 1;break;
      } break;
   case 'E':
      switch(name[1]) {
      case 'R': n = atomEr; break;
      case 'S': n = atomEs; break;
      case 'U': n = atomEu; break;
      case 'C': n = atomC;  emitWarning = 1;break;
      case 'H': n = atomH;  emitWarning = 1;break;
      case 'N': n = atomN;  emitWarning = 1;break;
      case 'O': n = atomO;  emitWarning = 1;break;
      case 'P': n = atomP;  emitWarning = 1;break;
      } break;
   case 'F':
      switch(name[1]) {
      case 'E': n = atomFe; break;
      case 'M': n = atomFm; break;
      case 'R': n = atomFr; break;
      case 'C': n = atomC;  emitWarning = 1;break;
      case 'H': n = atomH;  emitWarning = 1;break;
      case 'N': n = atomN;  emitWarning = 1;break;
      case 'O': n = atomO;  emitWarning = 1;break;
      case 'P': n = atomP;  emitWarning = 1;break;
      } break;
   case 'G':
      switch(name[1]) {
      case 'A': n = atomGa; break;
      case 'D': n = atomGd; break;
      case 'E': n = atomGe; break;
      case 'C': n = atomC;  emitWarning = 1;break;
      case 'H': n = atomH;  emitWarning = 1;break;
      case 'N': n = atomN;  emitWarning = 1;break;
      case 'O': n = atomO;  emitWarning = 1;break;
      case 'P': n = atomP;  emitWarning = 1;break;
      } break;
   case 'H':
      switch(name[1]) {
      case 'E': n = fixAtomName(name,resname,1) ? atomHe : atomH; break;
      case 'F': n = fixAtomName(name,resname,1) ? atomHf : atomH; break;
      case 'G': n = fixAtomName(name,resname,1) ? atomHg : atomH; break;
      case 'O': n = fixAtomName(name,resname,1) ? atomHo : atomH; break;
/*      case 'S': n = fixAtomName(name,resname,1) ? atomHs : atomH; break; */
      default : n = atomH; break;
      } break;

/*    case 'E': */
/*  if (isdigit(name[2])) { n = atomH; emitWarning = 1;} */ /* Hepsilon?? */
/*  else {n = atomHe; emitWarning = 1;} */
/*  break; */
/*      case 'F': n = atomHf; emitWarning = 1;break; */
/*      case 'G': */
/*  if (isdigit(name[2])) { n = atomH; emitWarning = 1;} */ /* Hgamma?? */
/*  else {n = atomHg; emitWarning = 1;} */
/*  break; */
/*      case 'O': n = atomHo; emitWarning = 1;break; */
/*      default:  n = atomH;  emitWarning = 1;break; */
/*      } break; */

   case 'I':
      switch(name[1]) {
      case 'N': n = atomIn; break;
      case 'R': n = atomIr; break;
      } break;
   case 'K':
      if (name[1] == 'R') n = atomKr; break;
   case 'L':
      switch(name[1]) {
      case 'A': n = atomLa; break;
      case 'I': n = atomLi; break;
      case 'U': n = atomLu; break;
      } break;
   case 'M':
      switch(name[1]) {
      case 'D': n = atomMd; break;
      case 'G': n = atomMg; break;
      case 'N': n = atomMn; break;
      case 'O': n = atomMo; break;
      } break;
   case 'N':
      switch(name[1]) {
      case 'A': n = atomNa; emitWarning = 1;break;
      case 'B': n = atomNb; emitWarning = 1;break;
      case 'C': n = atomC;  emitWarning = 1;break;
      case 'D': n = atomNd; emitWarning = 1;break;
      case 'E': n = atomNe; emitWarning = 1;break;
      case 'H': n = atomH;  emitWarning = 1;break;
      case 'I': n = atomNi; break;
      case 'N': n = atomN;  emitWarning = 1;break;
      case 'O': n = atomO;  emitWarning = 1;break;/*nonstd!*/
      case 'P': n = atomP;  emitWarning = 1;break;/*nonstd!*/
      case 'S': n = atomS;  emitWarning = 1;break;
      default:  n = atomN;  emitWarning = 1;break;
      } break;
   case 'O':
      switch(name[1]) {
      case 'S': n = atomOs; break;
      default:  n = atomO;  emitWarning = 1;break;
      } break;
   case 'P':
      switch(name[1]) {
      case 'A': n = atomPa; emitWarning = 1;break;
      case 'B': n = atomPb; emitWarning = 1;break;
      case 'D': n = atomPd; emitWarning = 1;break;
      case 'M': n = atomPm; break;
      case 'O': n = atomPo; break;
      case 'R': n = atomPr; break;
      case 'T': n = atomPt; break;
      case 'U': n = atomPu; break;
      default:  n = atomP;  emitWarning = 1;break;
      } break;
   case 'R':
      switch(name[1]) {
      case 'A': n = atomRa; break;
      case 'B': n = atomRb; break;
      case 'E': n = atomRe; break;
      case 'H': n = atomRh; break;
      case 'N': n = atomRn; break;
      case 'U': n = atomRu; break;
      } break;
   case 'S':
      switch(name[1]) {
      case 'B': n = atomSb; emitWarning = 1;break;
      case 'C': n = atomSc; break;
      case 'E': n = atomSe; emitWarning = 1;break;
      case 'I': n = atomSi; break;
      case 'M': n = atomSm; break;
      case 'N': n = atomSn; break;
      case 'R': n = atomSr; break;
      default:  n = atomS;  emitWarning = 1;break;
      } break;
   case 'T':
      switch(name[1]) {
      case 'A': n = atomTa; break;
      case 'B': n = atomTb; break;
      case 'C': n = atomTc; break;
      case 'E': n = atomTe; break;
      case 'H': n = atomTh; break;
      case 'I': n = atomTi; break;
      case 'L': n = atomTl; break;
      case 'M': n = atomTm; break;
      } break;
   case 'X':
      if (name[1] == 'E') n = atomXe; break;
   case 'Y':
      if (name[1] == 'B') n = atomYb; break;
   case 'Z':
      switch(name[1]) {
      case 'N': n = atomZn; break;
      case 'R': n = atomZr; break;
      } break;
   default: break;
   }

   if (n < 0) { emitWarning = 1;
      n = atomC;

      switch(name[1]) {
      case 'H': case 'D': n = atomH; break;
      case 'C': n = atomC; break;
      case 'N': n = atomN; break;
      case 'O': n = atomO; break;
      case 'P': n = atomP; break;
      case 'S': n = atomS; break;

      case 'I': n = atomI; break;
      case 'K': n = atomK; break;
      case 'V': n = atomV; break;
      case 'W': n = atomW; break;
      case 'U': n = atomU; break;

      case 'A':
	 switch(name[2]) {
	 case 'G': n = atomAg; break;
	 case 'L': n = atomAl; break;
	 case 'S': n = atomAs; break;
	 case 'U': n = atomAu; break;
	 } break;
      case 'F':
	 if (name[2] == 'E') n = atomFe; break;
      case 'G':
	 if (name[2] == 'D') n = atomGd; break;
      case 'L':
	 if (name[2] == 'I') n = atomLi; break;
      case 'M':
	 switch(name[2]) {
	 case 'G': n = atomMg; break;
	 case 'N': n = atomMn; break;
	 case 'O': n = atomMo; break;
	 } break;
      case 'Z':
	 if (name[2] == 'N') n = atomZn; break;
/* --------- default if we fall through... ---------------------*/
      default: n = atomC; break;
      }
   }
   if (emitWarning && Verbose) {/*Verbose controlled dcr041007*/
      char warnstr[5]={'_','_','_','_','\0'}; /*dcr041007*/
      char warnresn[5]={'_','_','_','_','\0'}; /*rmi070719*/
      char* atstr;
      int j=0;
      while(name[j]!='\0'&&warnstr[j]!='\0')
      {/*explicitly show blanks so can understand atom name problem*/
         if(name[j]==' ') {warnstr[j]='_';}
         else             {warnstr[j]=name[j];}
         j++;
      }
      j=0;
      while(resname[j]!='\0'&&warnresn[j]!='\0')
      {/*explicitly show blanks so can understand residue/atom name problem*/
         if(name[j]==' ') {warnresn[j]='_';}
         else             {warnresn[j]=resname[j];}
         j++;
      }
      atstr = getAtomName(n);
      if(strlen(atstr)==1)
           {fprintf(stderr,"WARNING: atom %s from resn %s will be treated as  %s\n",warnstr,warnresn,atstr);}
      else {fprintf(stderr,"WARNING: atom %s from resn %s will be treated as %s\n",warnstr,warnresn,atstr);}
         /*name, getAtomName(n));*/
   }

   return n;
}